

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall pfederc::MatchExpr::~MatchExpr(MatchExpr *this)

{
  ~MatchExpr(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

MatchExpr::~MatchExpr() {
}